

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTableFormatter.cpp
# Opt level: O2

ostream * cali::format_record_as_table
                    (CaliperMetadataAccessInterface *db,
                    vector<cali::Entry,_std::allocator<cali::Entry>_> *rec,ostream *os)

{
  pointer pEVar1;
  pointer pEVar2;
  ostream *poVar3;
  Node *pNVar4;
  int iVar5;
  pointer pEVar6;
  size_t max_width;
  pointer str;
  bool bVar7;
  RecordInfo info;
  string local_58;
  
  info.entries.
  super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info.max_key_len = 0;
  info.max_right_len = 0;
  info.entries.
  super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  info.entries.
  super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1 = (rec->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar6 = (rec->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pEVar2 = info.entries.
               super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish, pEVar6 != pEVar1; pEVar6 = pEVar6 + 1) {
    pNVar4 = pEVar6->m_node;
    if (pNVar4 != (Node *)0x0) {
      if (pNVar4->m_attribute == 8) {
        local_58._M_dataplus._M_p = (pointer)(pEVar6->m_value).m_v.type_and_size;
        local_58._M_string_length = *(size_type *)&(pEVar6->m_value).m_v.value;
        anon_unknown.dwarf_168c7d::RecordInfo::add(&info,db,pNVar4->m_id,(Variant *)&local_58);
      }
      else {
        for (; (pNVar4 != (Node *)0x0 && (pNVar4->m_attribute != 0xffffffffffffffff));
            pNVar4 = *(Node **)((long)&(((pNVar4->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                       super_LockfreeIntrusiveTree<cali::Node>).m_me +
                               (pNVar4->super_LockfreeIntrusiveTree<cali::Node>).m_node)) {
          local_58._M_dataplus._M_p = (pointer)(pNVar4->m_data).m_v.type_and_size;
          local_58._M_string_length = *(size_type *)&(pNVar4->m_data).m_v.value;
          anon_unknown.dwarf_168c7d::RecordInfo::add
                    (&info,db,pNVar4->m_attribute,(Variant *)&local_58);
        }
      }
    }
  }
  max_width = 0x18;
  if (info.max_key_len < 0x18) {
    max_width = info.max_key_len;
  }
  iVar5 = 0;
  for (str = info.entries.
             super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
             ._M_impl.super__Vector_impl_data._M_start; str != pEVar2; str = str + 1) {
    bVar7 = iVar5 != 0;
    iVar5 = iVar5 + -1;
    if (bVar7) {
      std::operator<<(os,"\n");
    }
    util::clamp_string(&local_58,&str->key,max_width);
    poVar3 = util::pad_right(os,&local_58,max_width);
    std::operator<<(poVar3,": ");
    std::__cxx11::string::~string((string *)&local_58);
    if (str->align_right == true) {
      util::pad_left(os,&str->val,info.max_right_len);
    }
    else {
      util::clamp_string(&local_58,&str->val,0x34);
      std::operator<<(os,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  poVar3 = std::operator<<(os,"\n");
  anon_unknown.dwarf_168c7d::RecordInfo::~RecordInfo(&info);
  return poVar3;
}

Assistant:

std::ostream& format_record_as_table(
    CaliperMetadataAccessInterface& db,
    const std::vector<Entry>&       rec,
    std::ostream&                   os
)
{
    return ::write_record_data(::unpack_record(db, rec), os);
}